

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

void insert_helper<QStringView>(QString *str,qsizetype i,QStringView *toInsert)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char16_t *b;
  QArrayData *data;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  long lVar19;
  qsizetype qVar20;
  ulong uVar21;
  size_t __n;
  difference_type __d_1;
  long lVar22;
  long lVar23;
  long lVar24;
  char16_t *char16String_1;
  char16_t *b_00;
  char16_t *char16String;
  long lVar25;
  long in_FS_OFFSET;
  int iVar29;
  undefined1 auVar26 [16];
  int iVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar50;
  int iVar59;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar60;
  int iVar63;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar68 [16];
  undefined1 local_58 [16];
  ulong local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar24 = (str->d).size;
  lVar25 = i - lVar24;
  if (lVar25 == 0 || i < lVar24) {
    lVar25 = 0;
  }
  lVar1 = toInsert->m_size;
  lVar23 = lVar1 + lVar25 + lVar24;
  pDVar2 = (str->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0011f102:
    pcVar3 = (str->d).ptr;
    b_00 = pcVar3 + i;
    if (lVar25 != 0) {
      b_00 = pcVar3 + lVar24;
    }
    local_58 = (undefined1  [16])0x0;
    local_48 = 0;
    QArrayDataPointer<char16_t>::detachAndGrow
              ((QArrayDataPointer<char16_t> *)local_58,(uint)(i == 0),lVar23,(char16_t **)0x0,
               (QArrayDataPointer<char16_t> *)0x0);
    if ((pcVar3 != (char16_t *)0x0) && (0 < (long)b_00 - (long)pcVar3)) {
      QtPrivate::QCommonArrayOps<char16_t>::growAppend
                ((QCommonArrayOps<char16_t> *)local_58,pcVar3,
                 (char16_t *)(((long)b_00 - (long)pcVar3) + (long)pcVar3));
      *(char16_t *)(local_58._8_8_ + local_48 * 2) = L'\0';
    }
    uVar21 = local_48;
    QString::resize((QString *)local_58,i);
    auVar17 = _DAT_00138790;
    auVar16 = _DAT_00138780;
    auVar15 = _DAT_00138770;
    auVar14 = _DAT_00138760;
    auVar13 = _DAT_00138750;
    if (uVar21 < local_48) {
      uVar18 = (local_48 * 2 + uVar21 * -2) - 2;
      auVar34._8_4_ = (int)uVar18;
      auVar34._0_8_ = uVar18;
      auVar34._12_4_ = (int)(uVar18 >> 0x20);
      auVar26._0_8_ = uVar18 >> 1;
      auVar26._8_8_ = auVar34._8_8_ >> 1;
      lVar25 = 0;
      auVar26 = auVar26 ^ _DAT_00138790;
      do {
        auVar42._8_4_ = (int)lVar25;
        auVar42._0_8_ = lVar25;
        auVar42._12_4_ = (int)((ulong)lVar25 >> 0x20);
        auVar34 = (auVar42 | auVar16) ^ auVar17;
        iVar50 = auVar26._0_4_;
        iVar60 = -(uint)(iVar50 < auVar34._0_4_);
        iVar29 = auVar26._4_4_;
        auVar35._4_4_ = -(uint)(iVar29 < auVar34._4_4_);
        iVar59 = auVar26._8_4_;
        iVar63 = -(uint)(iVar59 < auVar34._8_4_);
        iVar30 = auVar26._12_4_;
        auVar35._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
        auVar51._4_4_ = iVar60;
        auVar51._0_4_ = iVar60;
        auVar51._8_4_ = iVar63;
        auVar51._12_4_ = iVar63;
        auVar64 = pshuflw(in_XMM11,auVar51,0xe8);
        auVar37._4_4_ = -(uint)(auVar34._4_4_ == iVar29);
        auVar37._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
        auVar37._0_4_ = auVar37._4_4_;
        auVar37._8_4_ = auVar37._12_4_;
        auVar68 = pshuflw(in_XMM12,auVar37,0xe8);
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar34 = pshuflw(auVar64,auVar35,0xe8);
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar65 = (auVar34 | auVar68 & auVar64) ^ auVar65;
        auVar34 = packssdw(auVar65,auVar65);
        if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar21 + lVar25) * 2) = L' ';
        }
        auVar35 = auVar37 & auVar51 | auVar35;
        auVar34 = packssdw(auVar35,auVar35);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar4,auVar34 ^ auVar4);
        if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
          *(char16_t *)(local_58._8_8_ + (uVar21 + lVar25 + 1) * 2) = L' ';
        }
        auVar34 = (auVar42 | auVar15) ^ auVar17;
        iVar60 = -(uint)(iVar50 < auVar34._0_4_);
        auVar61._4_4_ = -(uint)(iVar29 < auVar34._4_4_);
        iVar63 = -(uint)(iVar59 < auVar34._8_4_);
        auVar61._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
        auVar36._4_4_ = iVar60;
        auVar36._0_4_ = iVar60;
        auVar36._8_4_ = iVar63;
        auVar36._12_4_ = iVar63;
        auVar52._4_4_ = -(uint)(auVar34._4_4_ == iVar29);
        auVar52._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
        auVar52._0_4_ = auVar52._4_4_;
        auVar52._8_4_ = auVar52._12_4_;
        auVar61._0_4_ = auVar61._4_4_;
        auVar61._8_4_ = auVar61._12_4_;
        auVar34 = auVar52 & auVar36 | auVar61;
        auVar34 = packssdw(auVar34,auVar34);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
        if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar21 + lVar25 + 2) * 2) = L' ';
        }
        auVar65 = pshufhw(auVar36,auVar36,0x84);
        auVar35 = pshufhw(auVar52,auVar52,0x84);
        auVar37 = pshufhw(auVar65,auVar61,0x84);
        auVar38._8_4_ = 0xffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar38._12_4_ = 0xffffffff;
        auVar38 = (auVar37 | auVar35 & auVar65) ^ auVar38;
        auVar65 = packssdw(auVar38,auVar38);
        if ((auVar65 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar21 + lVar25 + 3) * 2) = L' ';
        }
        auVar65 = (auVar42 | auVar14) ^ auVar17;
        iVar60 = -(uint)(iVar50 < auVar65._0_4_);
        auVar40._4_4_ = -(uint)(iVar29 < auVar65._4_4_);
        iVar63 = -(uint)(iVar59 < auVar65._8_4_);
        auVar40._12_4_ = -(uint)(iVar30 < auVar65._12_4_);
        auVar53._4_4_ = iVar60;
        auVar53._0_4_ = iVar60;
        auVar53._8_4_ = iVar63;
        auVar53._12_4_ = iVar63;
        auVar34 = pshuflw(auVar34,auVar53,0xe8);
        auVar39._4_4_ = -(uint)(auVar65._4_4_ == iVar29);
        auVar39._12_4_ = -(uint)(auVar65._12_4_ == iVar30);
        auVar39._0_4_ = auVar39._4_4_;
        auVar39._8_4_ = auVar39._12_4_;
        in_XMM12 = pshuflw(auVar68 & auVar64,auVar39,0xe8);
        in_XMM12 = in_XMM12 & auVar34;
        auVar40._0_4_ = auVar40._4_4_;
        auVar40._8_4_ = auVar40._12_4_;
        auVar34 = pshuflw(auVar34,auVar40,0xe8);
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar64 = (auVar34 | in_XMM12) ^ auVar64;
        in_XMM11 = packssdw(auVar64,auVar64);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar21 + lVar25 + 4) * 2) = L' ';
        }
        auVar40 = auVar39 & auVar53 | auVar40;
        auVar34 = packssdw(auVar40,auVar40);
        auVar68._8_4_ = 0xffffffff;
        auVar68._0_8_ = 0xffffffffffffffff;
        auVar68._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar68,auVar34 ^ auVar68);
        if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar21 + lVar25 + 5) * 2) = L' ';
        }
        auVar34 = (auVar42 | auVar13) ^ auVar17;
        iVar50 = -(uint)(iVar50 < auVar34._0_4_);
        auVar54._4_4_ = -(uint)(iVar29 < auVar34._4_4_);
        iVar59 = -(uint)(iVar59 < auVar34._8_4_);
        auVar54._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
        auVar41._4_4_ = iVar50;
        auVar41._0_4_ = iVar50;
        auVar41._8_4_ = iVar59;
        auVar41._12_4_ = iVar59;
        auVar31._4_4_ = -(uint)(auVar34._4_4_ == iVar29);
        auVar31._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
        auVar31._0_4_ = auVar31._4_4_;
        auVar31._8_4_ = auVar31._12_4_;
        auVar54._0_4_ = auVar54._4_4_;
        auVar54._8_4_ = auVar54._12_4_;
        auVar34 = auVar31 & auVar41 | auVar54;
        auVar34 = packssdw(auVar34,auVar34);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar6,auVar34 ^ auVar6);
        if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar21 + lVar25 + 6) * 2) = L' ';
        }
        auVar65 = pshufhw(auVar41,auVar41,0x84);
        auVar34 = pshufhw(auVar31,auVar31,0x84);
        auVar42 = pshufhw(auVar65,auVar54,0x84);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 & auVar65,(auVar42 | auVar34 & auVar65) ^ auVar7);
        if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar21 + lVar25 + 7) * 2) = L' ';
        }
        lVar25 = lVar25 + 8;
      } while ((uVar18 >> 4) * 8 + 8 != lVar25);
    }
    b = toInsert->m_data;
    if (0 < toInsert->m_size && b != (char16_t *)0x0) {
      QtPrivate::QCommonArrayOps<char16_t>::growAppend
                ((QCommonArrayOps<char16_t> *)local_58,b,b + toInsert->m_size);
      *(char16_t *)(local_58._8_8_ + local_48 * 2) = L'\0';
    }
    if ((b_00 != (char16_t *)0x0) && (lVar24 = (long)(pcVar3 + lVar24) - (long)b_00, 0 < lVar24)) {
      QtPrivate::QCommonArrayOps<char16_t>::growAppend
                ((QCommonArrayOps<char16_t> *)local_58,b_00,(char16_t *)(lVar24 + (long)b_00));
      *(char16_t *)(local_58._8_8_ + local_48 * 2) = L'\0';
    }
    data = &((str->d).d)->super_QArrayData;
    auVar13._0_8_ = (str->d).d;
    auVar13._8_8_ = (str->d).ptr;
    (str->d).d = (Data *)local_58._0_8_;
    (str->d).ptr = (char16_t *)local_58._8_8_;
    qVar20 = (str->d).size;
    (str->d).size = local_48;
    local_58 = auVar13;
    local_48 = qVar20;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  else {
    if (pDVar2 == (Data *)0x0) {
      lVar19 = 0;
      lVar22 = 0;
    }
    else {
      lVar19 = (pDVar2->super_QArrayData).alloc;
      lVar22 = (long)((long)(str->d).ptr -
                     ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 1;
    }
    if (lVar19 - lVar22 < lVar23) goto LAB_0011f102;
    QArrayDataPointer<char16_t>::detachAndGrow
              (&str->d,(uint)(i == 0),lVar1 + lVar25,(char16_t **)0x0,
               (QArrayDataPointer<char16_t> *)0x0);
    QString::resize(str,lVar23);
    auVar17 = _DAT_00138790;
    auVar16 = _DAT_00138780;
    auVar15 = _DAT_00138770;
    auVar14 = _DAT_00138760;
    auVar13 = _DAT_00138750;
    pcVar3 = (str->d).ptr;
    if (0 < lVar25) {
      qVar20 = i;
      if (i < lVar24) {
        qVar20 = lVar24;
      }
      uVar21 = (qVar20 * 2 + lVar24 * -2) - 2;
      auVar27._8_4_ = (int)uVar21;
      auVar27._0_8_ = uVar21;
      auVar27._12_4_ = (int)(uVar21 >> 0x20);
      auVar28._0_8_ = uVar21 >> 1;
      auVar28._8_8_ = auVar27._8_8_ >> 1;
      lVar23 = 0;
      auVar28 = auVar28 ^ _DAT_00138790;
      do {
        auVar32._8_4_ = (int)lVar23;
        auVar32._0_8_ = lVar23;
        auVar32._12_4_ = (int)((ulong)lVar23 >> 0x20);
        auVar34 = (auVar32 | auVar16) ^ auVar17;
        iVar50 = auVar28._0_4_;
        iVar60 = -(uint)(iVar50 < auVar34._0_4_);
        iVar29 = auVar28._4_4_;
        auVar44._4_4_ = -(uint)(iVar29 < auVar34._4_4_);
        iVar59 = auVar28._8_4_;
        iVar63 = -(uint)(iVar59 < auVar34._8_4_);
        iVar30 = auVar28._12_4_;
        auVar44._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
        auVar55._4_4_ = iVar60;
        auVar55._0_4_ = iVar60;
        auVar55._8_4_ = iVar63;
        auVar55._12_4_ = iVar63;
        auVar26 = pshuflw(in_XMM11,auVar55,0xe8);
        auVar43._4_4_ = -(uint)(auVar34._4_4_ == iVar29);
        auVar43._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        auVar65 = pshuflw(in_XMM12,auVar43,0xe8);
        auVar44._0_4_ = auVar44._4_4_;
        auVar44._8_4_ = auVar44._12_4_;
        auVar34 = pshuflw(auVar26,auVar44,0xe8);
        auVar66._8_4_ = 0xffffffff;
        auVar66._0_8_ = 0xffffffffffffffff;
        auVar66._12_4_ = 0xffffffff;
        auVar66 = (auVar34 | auVar65 & auVar26) ^ auVar66;
        auVar34 = packssdw(auVar66,auVar66);
        if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar3[lVar24 + lVar23] = L' ';
        }
        auVar44 = auVar43 & auVar55 | auVar44;
        auVar34 = packssdw(auVar44,auVar44);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar8,auVar34 ^ auVar8);
        if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
          pcVar3[lVar24 + lVar23 + 1] = L' ';
        }
        auVar34 = (auVar32 | auVar15) ^ auVar17;
        iVar60 = -(uint)(iVar50 < auVar34._0_4_);
        auVar62._4_4_ = -(uint)(iVar29 < auVar34._4_4_);
        iVar63 = -(uint)(iVar59 < auVar34._8_4_);
        auVar62._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
        auVar45._4_4_ = iVar60;
        auVar45._0_4_ = iVar60;
        auVar45._8_4_ = iVar63;
        auVar45._12_4_ = iVar63;
        auVar56._4_4_ = -(uint)(auVar34._4_4_ == iVar29);
        auVar56._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar34 = auVar56 & auVar45 | auVar62;
        auVar34 = packssdw(auVar34,auVar34);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar9,auVar34 ^ auVar9);
        if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pcVar3[lVar24 + lVar23 + 2] = L' ';
        }
        auVar42 = pshufhw(auVar45,auVar45,0x84);
        auVar35 = pshufhw(auVar56,auVar56,0x84);
        auVar37 = pshufhw(auVar42,auVar62,0x84);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar46 = (auVar37 | auVar35 & auVar42) ^ auVar46;
        auVar42 = packssdw(auVar46,auVar46);
        if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pcVar3[lVar24 + lVar23 + 3] = L' ';
        }
        auVar42 = (auVar32 | auVar14) ^ auVar17;
        iVar60 = -(uint)(iVar50 < auVar42._0_4_);
        auVar48._4_4_ = -(uint)(iVar29 < auVar42._4_4_);
        iVar63 = -(uint)(iVar59 < auVar42._8_4_);
        auVar48._12_4_ = -(uint)(iVar30 < auVar42._12_4_);
        auVar57._4_4_ = iVar60;
        auVar57._0_4_ = iVar60;
        auVar57._8_4_ = iVar63;
        auVar57._12_4_ = iVar63;
        auVar34 = pshuflw(auVar34,auVar57,0xe8);
        auVar47._4_4_ = -(uint)(auVar42._4_4_ == iVar29);
        auVar47._12_4_ = -(uint)(auVar42._12_4_ == iVar30);
        auVar47._0_4_ = auVar47._4_4_;
        auVar47._8_4_ = auVar47._12_4_;
        in_XMM12 = pshuflw(auVar65 & auVar26,auVar47,0xe8);
        in_XMM12 = in_XMM12 & auVar34;
        auVar48._0_4_ = auVar48._4_4_;
        auVar48._8_4_ = auVar48._12_4_;
        auVar34 = pshuflw(auVar34,auVar48,0xe8);
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar67 = (auVar34 | in_XMM12) ^ auVar67;
        in_XMM11 = packssdw(auVar67,auVar67);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar3[lVar24 + lVar23 + 4] = L' ';
        }
        auVar48 = auVar47 & auVar57 | auVar48;
        auVar34 = packssdw(auVar48,auVar48);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar10,auVar34 ^ auVar10);
        if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pcVar3[lVar24 + lVar23 + 5] = L' ';
        }
        auVar34 = (auVar32 | auVar13) ^ auVar17;
        iVar50 = -(uint)(iVar50 < auVar34._0_4_);
        auVar58._4_4_ = -(uint)(iVar29 < auVar34._4_4_);
        iVar59 = -(uint)(iVar59 < auVar34._8_4_);
        auVar58._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
        auVar49._4_4_ = iVar50;
        auVar49._0_4_ = iVar50;
        auVar49._8_4_ = iVar59;
        auVar49._12_4_ = iVar59;
        auVar33._4_4_ = -(uint)(auVar34._4_4_ == iVar29);
        auVar33._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
        auVar33._0_4_ = auVar33._4_4_;
        auVar33._8_4_ = auVar33._12_4_;
        auVar58._0_4_ = auVar58._4_4_;
        auVar58._8_4_ = auVar58._12_4_;
        auVar34 = auVar33 & auVar49 | auVar58;
        auVar34 = packssdw(auVar34,auVar34);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar11,auVar34 ^ auVar11);
        if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pcVar3[lVar24 + lVar23 + 6] = L' ';
        }
        auVar26 = pshufhw(auVar49,auVar49,0x84);
        auVar34 = pshufhw(auVar33,auVar33,0x84);
        auVar65 = pshufhw(auVar26,auVar58,0x84);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 & auVar26,(auVar65 | auVar34 & auVar26) ^ auVar12);
        if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pcVar3[lVar24 + lVar23 + 7] = L' ';
        }
        lVar23 = lVar23 + 8;
      } while ((uVar21 >> 4) * 8 + 8 != lVar23);
    }
    if (i != lVar24 && lVar25 == 0) {
      __n = lVar24 * 2 + i * -2;
      memmove((void *)((long)pcVar3 + ((str->d).size * 2 - __n)),pcVar3 + i,__n);
    }
    if (0 < lVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        memmove(pcVar3 + i,toInsert->m_data,lVar1 * 2);
        return;
      }
      goto LAB_0011f8b5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0011f8b5:
  __stack_chk_fail();
}

Assistant:

static void insert_helper(QString &str, qsizetype i, const T &toInsert)
{
    auto &str_d = str.data_ptr();
    qsizetype difference = 0;
    if (Q_UNLIKELY(i > str_d.size))
        difference = i - str_d.size;
    const qsizetype oldSize = str_d.size;
    const qsizetype insert_size = toInsert.size();
    const qsizetype newSize = str_d.size + difference + insert_size;
    const auto side = i == 0 ? QArrayData::GrowsAtBeginning : QArrayData::GrowsAtEnd;

    if (str_d.needsDetach() || needsReallocate(str, newSize)) {
        const auto cbegin = str.cbegin();
        const auto cend = str.cend();
        const auto insert_start = difference == 0 ? std::next(cbegin, i) : cend;
        QString other;
        // Using detachAndGrow() so that prepend optimization works and QStringBuilder
        // unittests pass
        other.data_ptr().detachAndGrow(side, newSize, nullptr, nullptr);
        other.append(QStringView(cbegin, insert_start));
        other.resize(i, u' ');
        other.append(toInsert);
        other.append(QStringView(insert_start, cend));
        str.swap(other);
        return;
    }

    str_d.detachAndGrow(side, difference + insert_size, nullptr, nullptr);
    Q_CHECK_PTR(str_d.data());
    str.resize(newSize);

    auto begin = str_d.begin();
    auto old_end = std::next(begin, oldSize);
    std::fill_n(old_end, difference, u' ');
    auto insert_start = std::next(begin, i);
    if (difference == 0)
        std::move_backward(insert_start, old_end, str_d.end());

    using Char = std::remove_cv_t<typename T::value_type>;
    if constexpr(std::is_same_v<Char, QChar>)
        std::copy_n(reinterpret_cast<const char16_t *>(toInsert.data()), insert_size, insert_start);
    else if constexpr (std::is_same_v<Char, char16_t>)
        std::copy_n(toInsert.data(), insert_size, insert_start);
    else if constexpr (std::is_same_v<Char, char>)
        qt_from_latin1(insert_start, toInsert.data(), insert_size);
}